

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedChangeSize::Run(AdvancedChangeSize *this)

{
  byte bVar1;
  void *pvVar2;
  byte bVar3;
  GLuint GVar4;
  GLint location;
  GLint GVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ostream *poVar9;
  ulong uVar10;
  char *pcVar11;
  int i;
  long lVar12;
  ulong uVar13;
  bool *pbVar14;
  int i_1;
  GLsizei GVar15;
  CallLogWrapper *pCVar16;
  byte bVar17;
  long lVar18;
  AdvancedChangeSize *pAVar19;
  GLint v0;
  bool bVar20;
  float fVar21;
  bool local_271;
  GLint length_1;
  GLint GStack_26c;
  GLint local_264;
  GLint local_260;
  byte local_25a;
  allocator_type local_259;
  CallLogWrapper *local_258;
  float local_250;
  undefined4 local_24c;
  GLint length;
  undefined4 uStack_244;
  long local_238 [2];
  ulong local_228;
  int local_21c;
  float local_218;
  int local_214;
  float local_210;
  float local_20c;
  GLint attached_shaders;
  undefined4 uStack_204;
  pointer local_1f8;
  GLint status;
  undefined4 uStack_1ec;
  pointer local_1e0;
  ulong local_1d8;
  AdvancedChangeSize *local_1d0;
  GLenum type;
  undefined8 uStack_1c0;
  char *glsl_fs;
  char *glsl_vs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  ios_base local_138 [264];
  
  glsl_vs = 
  "#version 430 core\nout gl_PerVertex { vec4 gl_Position; };\nconst vec2 g_position[3] = { vec2(-1, -1), vec2(3, -1), vec2(-1, 3) };\nvoid main() { gl_Position = vec4(g_position[gl_VertexID], 0, 1); }"
  ;
  glsl_fs = 
  "#version 430 core\nlayout(location = 0) out vec4 g_color;\nlayout(binding = 0, rgba8) uniform image2D g_image[2];\nuniform ivec2 g_expected_size[2];\nuniform int g_0 = 0, g_1 = 1;\nvoid main() {\n  vec4 c = vec4(0, 1, 0, 1);\n  if (imageSize(g_image[g_0]).xy != g_expected_size[g_0]) c = vec4(1, 0, 0, 1);\n  if (imageSize(g_image[g_1]).yx != g_expected_size[g_1]) c = vec4(1, 0, 0, 1);\n  g_color = c;\n}"
  ;
  pCVar16 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar4 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar16,0x8b31,1,&glsl_vs);
  this->m_program[0] = GVar4;
  local_258 = pCVar16;
  GVar4 = glu::CallLogWrapper::glCreateShaderProgramv(pCVar16,0x8b30,1,&glsl_fs);
  this->m_program[1] = GVar4;
  lVar12 = 0;
  local_1d0 = this;
  do {
    GVar4 = local_1d0->m_program[lVar12];
    if (GVar4 != 0) {
      glu::CallLogWrapper::glGetProgramiv(local_258,GVar4,0x8b82,&status);
      if (status == 0) {
        glu::CallLogWrapper::glGetProgramiv(local_258,GVar4,0x8b85,&attached_shaders);
        if (0 < (long)attached_shaders) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&shaders,(long)attached_shaders,(allocator_type *)&length);
          glu::CallLogWrapper::glGetAttachedShaders
                    (local_258,GVar4,attached_shaders,(GLsizei *)0x0,
                     shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start);
          if (0 < attached_shaders) {
            lVar18 = 0;
            do {
              glu::CallLogWrapper::glGetShaderiv
                        (local_258,
                         shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar18],0x8b4f,(GLint *)&type);
              if ((int)type < 0x8e87) {
                if (type == 0x8b30) {
                  pcVar11 = "*** Fragment Shader ***\n";
                }
                else {
                  pcVar11 = "*** Vertex Shader ***\n";
                  if (type != 0x8b31) {
                    if (type == 0x8dd9) {
                      pcVar11 = "*** Geometry Shader ***\n";
                    }
                    else {
LAB_00a1cfb0:
                      pcVar11 = "*** Unknown Shader ***\n";
                    }
                  }
                }
              }
              else if (type == 0x8e87) {
                pcVar11 = "*** Tessellation Evaluation Shader ***\n";
              }
              else if (type == 0x8e88) {
                pcVar11 = "*** Tessellation Control Shader ***\n";
              }
              else {
                if (type != 0x91b9) goto LAB_00a1cfb0;
                pcVar11 = "*** Compute Shader ***\n";
              }
              anon_unknown_0::Output(pcVar11);
              glu::CallLogWrapper::glGetShaderiv
                        (local_258,
                         shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar18],0x8b88,&length_1);
              if (0 < (long)length_1) {
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)&length,(long)length_1,&local_259)
                ;
                glu::CallLogWrapper::glGetShaderSource
                          (local_258,
                           shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar18],length_1,(GLsizei *)0x0,
                           (GLchar *)CONCAT44(uStack_244,length));
                anon_unknown_0::Output("%s\n",CONCAT44(uStack_244,length));
                pvVar2 = (void *)CONCAT44(uStack_244,length);
                if (pvVar2 != (void *)0x0) {
                  operator_delete(pvVar2,local_238[0] - (long)pvVar2);
                }
              }
              glu::CallLogWrapper::glGetShaderiv
                        (local_258,
                         shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar18],0x8b84,&length_1);
              if (0 < (long)length_1) {
                std::vector<char,_std::allocator<char>_>::vector
                          ((vector<char,_std::allocator<char>_> *)&length,(long)length_1,&local_259)
                ;
                glu::CallLogWrapper::glGetShaderInfoLog
                          (local_258,
                           shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar18],length_1,(GLsizei *)0x0,
                           (GLchar *)CONCAT44(uStack_244,length));
                anon_unknown_0::Output("%s\n",CONCAT44(uStack_244,length));
                pvVar2 = (void *)CONCAT44(uStack_244,length);
                if (pvVar2 != (void *)0x0) {
                  operator_delete(pvVar2,local_238[0] - (long)pvVar2);
                }
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < attached_shaders);
          }
          if (shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)shaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)shaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        glu::CallLogWrapper::glGetProgramiv(local_258,GVar4,0x8b84,&length);
        if (0 < (long)length) {
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&shaders,(long)length,
                     (allocator_type *)&type);
          glu::CallLogWrapper::glGetProgramInfoLog
                    (local_258,GVar4,length,(GLsizei *)0x0,
                     (GLchar *)
                     shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start);
          anon_unknown_0::Output
                    ("%s\n",shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          if (shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)shaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)shaders.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      if (status != 1) {
        return -1;
      }
    }
    pAVar19 = local_1d0;
    pCVar16 = local_258;
    bVar20 = lVar12 == 0;
    lVar12 = lVar12 + 1;
  } while (bVar20);
  glu::CallLogWrapper::glUseProgramStages(local_258,local_1d0->m_pipeline,1,local_1d0->m_program[0])
  ;
  glu::CallLogWrapper::glUseProgramStages(pCVar16,pAVar19->m_pipeline,2,pAVar19->m_program[1]);
  glu::CallLogWrapper::glBindVertexArray(pCVar16,pAVar19->m_vertex_array);
  glu::CallLogWrapper::glBindProgramPipeline(pCVar16,pAVar19->m_pipeline);
  _length_1 = 0x8000000020;
  lVar12 = 0;
  do {
    glu::CallLogWrapper::glBindTexture(pCVar16,0xde1,pAVar19->m_texture[lVar12]);
    glu::CallLogWrapper::glTexParameteri(pCVar16,0xde1,0x2801,0x2601);
    glu::CallLogWrapper::glTexParameteri(pCVar16,0xde1,0x2800,0x2601);
    glu::CallLogWrapper::glTexImage2D
              (pCVar16,0xde1,0,0x8058,(&length_1)[lVar12],(&length_1)[lVar12],0,0x1908,0x1406,
               (void *)0x0);
    glu::CallLogWrapper::glBindImageTexture
              (pCVar16,(GLuint)lVar12,pAVar19->m_texture[lVar12],0,'\0',0,35000,0x8058);
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  local_271 = true;
  local_1d8 = 0;
  GVar5 = length_1;
  v0 = GStack_26c;
  do {
    GVar4 = pAVar19->m_program[1];
    location = glu::CallLogWrapper::glGetUniformLocation(pCVar16,GVar4,"g_expected_size[0]");
    local_264 = GVar5;
    glu::CallLogWrapper::glProgramUniform2i(pCVar16,GVar4,location,GVar5,GVar5);
    GVar4 = pAVar19->m_program[1];
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(pCVar16,GVar4,"g_expected_size[1]");
    local_260 = v0;
    glu::CallLogWrapper::glProgramUniform2i(pCVar16,GVar4,GVar5,v0,v0);
    glu::CallLogWrapper::glClear(pCVar16,0x4000);
    glu::CallLogWrapper::glDrawArrays(pCVar16,4,0,3);
    iVar6 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = *(int *)CONCAT44(extraout_var,iVar6);
    iVar7 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               &attached_shaders,(long)(iVar6 * *(int *)(CONCAT44(extraout_var_00,iVar7) + 4)),
               (allocator_type *)&shaders);
    iVar6 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    GVar15 = *(GLsizei *)CONCAT44(extraout_var_01,iVar6);
    iVar6 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (pCVar16,0,0,GVar15,*(GLsizei *)(CONCAT44(extraout_var_02,iVar6) + 4),0x1907,0x1406,
               (void *)CONCAT44(uStack_204,attached_shaders));
    iVar6 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_228 = (ulong)*(int *)CONCAT44(extraout_var_03,iVar6);
    iVar6 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = *(int *)(CONCAT44(extraout_var_04,iVar6) + 4);
    iVar7 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    uVar10 = local_228;
    lVar12 = CONCAT44(extraout_var_05,iVar7);
    bVar3 = *(byte *)(lVar12 + 0xc);
    local_250 = (float)(1 << (*(byte *)(lVar12 + 8) & 0x1f));
    bVar17 = *(byte *)(lVar12 + 0x10);
    bVar1 = *(byte *)(lVar12 + 0x14);
    GVar15 = (GLsizei)local_228;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&status,
               (long)(iVar6 * GVar15),(allocator_type *)&shaders);
    uVar10 = uVar10 & 0xffffffff;
    glu::CallLogWrapper::glReadPixels
              (local_258,0,0,GVar15,iVar6,0x1908,0x1406,(void *)CONCAT44(uStack_1ec,status));
    pcVar11 = (char *)CONCAT71((int7)(uVar10 >> 8),iVar6 < 1);
    uVar8 = (uint)pcVar11;
    if (0 < iVar6) {
      fVar21 = 1.0 / (float)(int)local_250;
      local_250 = 1.0 / (float)(1 << (bVar3 & 0x1f));
      local_210 = 1.0 / (float)(1 << (bVar17 & 0x1f));
      local_218 = 1.0 / (float)(1 << (bVar1 & 0x1f));
      local_25a = 0 < (int)local_228;
      bVar3 = 1;
      local_24c = 0;
      iVar7 = 0;
      uVar10 = local_228;
      local_21c = iVar6;
      local_20c = fVar21;
      do {
        iVar6 = (int)uVar10;
        bVar17 = local_25a;
        local_214 = iVar7;
        if (0 < iVar6) {
          bVar17 = true;
          uVar13 = 0;
          do {
            lVar12 = (long)((int)uVar13 + iVar7 * iVar6) * 0x10;
            pcVar11 = (char *)(CONCAT44(uStack_1ec,status) + lVar12);
            if (((fVar21 < ABS(*(float *)(CONCAT44(uStack_1ec,status) + lVar12))) ||
                (local_250 < ABS(*(float *)(pcVar11 + 4) + -1.0))) ||
               (local_210 < ABS(*(float *)(pcVar11 + 8)))) {
              bVar20 = false;
            }
            else {
              bVar20 = ABS(*(float *)(pcVar11 + 0xc) + -1.0) <= local_218;
            }
            if (!bVar20) {
              _type = *(undefined8 *)pcVar11;
              uStack_1c0 = *(undefined8 *)(pcVar11 + 8);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaders);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&shaders,"[",1);
              lVar12 = 0;
              do {
                poVar9 = std::ostream::_M_insert<double>((double)(float)(&type)[lVar12]);
                pbVar14 = glcts::fixed_sample_locations_values + 1;
                pcVar11 = ",";
                if (lVar12 != 3) {
                  pbVar14 = (bool *)0x1cf260d;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,pbVar14,(ulong)(lVar12 != 3));
                lVar12 = lVar12 + 1;
              } while (lVar12 != 4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&shaders,"]",1);
              std::__cxx11::stringbuf::str();
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaders);
              std::ios_base::~ios_base(local_138);
              anon_unknown_0::Output("First bad color: %s.\n",CONCAT44(uStack_244,length));
              if ((long *)CONCAT44(uStack_244,length) != local_238) {
                operator_delete((long *)CONCAT44(uStack_244,length),local_238[0] + 1);
              }
              bVar3 = 0;
              uVar10 = local_228;
              fVar21 = local_20c;
            }
            if (!bVar20) break;
            uVar13 = uVar13 + 1;
            bVar17 = (long)uVar13 < (long)uVar10;
          } while (uVar13 != uVar10);
        }
        if ((bVar17 & 1) != 0) break;
        iVar7 = local_214 + 1;
        pcVar11 = (char *)CONCAT71((int7)((ulong)pcVar11 >> 8),local_21c <= iVar7);
        local_24c = SUB84(pcVar11,0);
      } while (iVar7 != local_21c);
      uVar8 = (uint)((byte)local_24c & bVar3);
    }
    pvVar2 = (void *)CONCAT44(uStack_1ec,status);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_1e0 - (long)pvVar2);
    }
    GVar5 = local_264;
    pvVar2 = (void *)CONCAT44(uStack_204,attached_shaders);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_1f8 - (long)pvVar2);
    }
    pAVar19 = local_1d0;
    pCVar16 = local_258;
    if ((uVar8 & 1) == 0) break;
    GVar5 = GVar5 / 2;
    v0 = local_260 / 2;
    glu::CallLogWrapper::glBindTexture(local_258,0xde1,local_1d0->m_texture[0]);
    glu::CallLogWrapper::glTexImage2D
              (pCVar16,0xde1,0,0x8058,GVar5,GVar5,0,0x1908,0x1406,(void *)0x0);
    glu::CallLogWrapper::glBindTexture(pCVar16,0xde1,pAVar19->m_texture[1]);
    glu::CallLogWrapper::glTexImage2D(pCVar16,0xde1,0,0x8058,v0,v0,0,0x1908,0x1406,(void *)0x0);
    local_271 = (uint)local_1d8 < 2;
    uVar8 = (uint)local_1d8 + 1;
    local_1d8 = (ulong)uVar8;
  } while (uVar8 != 3);
  return -(ulong)local_271;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = "#version 430 core" NL "out gl_PerVertex { vec4 gl_Position; };" NL
									"const vec2 g_position[3] = { vec2(-1, -1), vec2(3, -1), vec2(-1, 3) };" NL
									"void main() { gl_Position = vec4(g_position[gl_VertexID], 0, 1); }";
		const char* const glsl_fs =
			"#version 430 core" NL "layout(location = 0) out vec4 g_color;" NL
			"layout(binding = 0, rgba8) uniform image2D g_image[2];" NL "uniform ivec2 g_expected_size[2];" NL
			"uniform int g_0 = 0, g_1 = 1;" NL "void main() {" NL "  vec4 c = vec4(0, 1, 0, 1);" NL
			"  if (imageSize(g_image[g_0]).xy != g_expected_size[g_0]) c = vec4(1, 0, 0, 1);" NL
			"  if (imageSize(g_image[g_1]).yx != g_expected_size[g_1]) c = vec4(1, 0, 0, 1);" NL "  g_color = c;" NL
			"}";
		m_program[0] = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		m_program[1] = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
		for (int i = 0; i < 2; ++i)
			if (!CheckProgram(m_program[i]))
				return ERROR;

		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_program[1]);

		glBindVertexArray(m_vertex_array);
		glBindProgramPipeline(m_pipeline);

		int size[2] = { 32, 128 };
		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[i], size[i], 0, GL_RGBA, GL_FLOAT, NULL);
			glBindImageTexture(i, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA8);
		}

		for (int i = 0; i < 3; ++i)
		{
			glProgramUniform2i(m_program[1], glGetUniformLocation(m_program[1], "g_expected_size[0]"), size[0],
							   size[0]);
			glProgramUniform2i(m_program[1], glGetUniformLocation(m_program[1], "g_expected_size[1]"), size[1],
							   size[1]);
			glClear(GL_COLOR_BUFFER_BIT);
			glDrawArrays(GL_TRIANGLES, 0, 3);

			{
				bool			  status = true;
				std::vector<vec3> fb(getWindowWidth() * getWindowHeight());
				glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
				if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
					status = false;
				if (!status)
					return ERROR;
			}

			size[0] /= 2;
			size[1] /= 2;

			glBindTexture(GL_TEXTURE_2D, m_texture[0]);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[0], size[0], 0, GL_RGBA, GL_FLOAT, NULL);
			glBindTexture(GL_TEXTURE_2D, m_texture[1]);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[1], size[1], 0, GL_RGBA, GL_FLOAT, NULL);
		}
		return NO_ERROR;
	}